

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O3

ssize_t __thiscall xmrig::OclConfig::read(OclConfig *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  bool bVar2;
  EVP_PKEY_CTX *dst;
  Value *platform;
  char *devicesHint;
  ssize_t extraout_RAX;
  EVP_PKEY_CTX *src;
  void *__buf_00;
  undefined4 in_register_00000034;
  Value *obj;
  
  obj = (Value *)CONCAT44(in_register_00000034,__fd);
  uVar1 = (obj->data_).f.flags;
  if (uVar1 == 3) {
    bVar2 = Json::getBool(obj,"enabled",this->m_enabled);
    this->m_enabled = bVar2;
    bVar2 = Json::getBool(obj,"cache",this->m_cache);
    this->m_cache = bVar2;
    dst = (EVP_PKEY_CTX *)Json::getString(obj,"loader",(char *)0x0);
    String::copy(&this->m_loader,dst,src);
    platform = Json::getValue(obj,"platform");
    setPlatform(this,platform);
    devicesHint = Json::getString(obj,"devices-hint",(char *)0x0);
    setDevicesHint(this,devicesHint);
    Threads<xmrig::OclThreads>::read(&this->m_threads,__fd,__buf_00,__nbytes);
  }
  else if ((uVar1 & 8) == 0) {
    this->m_shouldSave = true;
  }
  else {
    this->m_enabled = uVar1 == 10;
  }
  generate(this);
  return extraout_RAX;
}

Assistant:

void xmrig::OclConfig::read(const rapidjson::Value &value)
{
    if (value.IsObject()) {
        m_enabled   = Json::getBool(value, kEnabled, m_enabled);
        m_cache     = Json::getBool(value, kCache, m_cache);
        m_loader    = Json::getString(value, kLoader);

        setPlatform(Json::getValue(value, kPlatform));
        setDevicesHint(Json::getString(value, kDevicesHint));

        m_threads.read(value);

        generate();
    }
    else if (value.IsBool()) {
        m_enabled = value.GetBool();

        generate();
    }
    else {
        m_shouldSave = true;

        generate();
    }
}